

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::TailoredSet::addPrefixes(TailoredSet *this,CollationData *d,UChar32 c,UChar *p)

{
  UBool UVar1;
  uint32_t ce32;
  UnicodeString *pfx;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  Iterator prefixes;
  UChar *p_local;
  UChar32 c_local;
  CollationData *d_local;
  TailoredSet *this_local;
  
  prefixes.stack_ = (UVector32 *)p;
  ConstChar16Ptr::ConstChar16Ptr(&local_a8,p);
  UCharsTrie::Iterator::Iterator((Iterator *)local_a0,&local_a8,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
  while( true ) {
    UVar1 = UCharsTrie::Iterator::next((Iterator *)local_a0,&this->errorCode);
    if (UVar1 == '\0') break;
    pfx = UCharsTrie::Iterator::getString((Iterator *)local_a0);
    ce32 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
    addPrefix(this,d,pfx,c,ce32);
  }
  UCharsTrie::Iterator::~Iterator((Iterator *)local_a0);
  return;
}

Assistant:

void
TailoredSet::addPrefixes(const CollationData *d, UChar32 c, const UChar *p) {
    UCharsTrie::Iterator prefixes(p, 0, errorCode);
    while(prefixes.next(errorCode)) {
        addPrefix(d, prefixes.getString(), c, (uint32_t)prefixes.getValue());
    }
}